

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

t_operand __thiscall
xemmai::ast::t_return::f_emit(t_return *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  size_t sVar1;
  t_targets *ptVar2;
  t_node *ptVar3;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar4;
  ulong uVar5;
  t_operand tVar6;
  t_null local_38;
  
  sVar1 = a_emit->v_stack;
  ptVar2 = a_emit->v_targets;
  a_emit->v_stack = ptVar2->v_return_stack;
  ptVar3 = (this->v_expression)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  if (ptVar3 == (t_node *)0x0) {
    local_38.super_t_node.v_at.v_position = (this->super_t_node).v_at.v_position;
    local_38.super_t_node.v_at.v_line = (this->super_t_node).v_at.v_line;
    local_38.super_t_node.v_at.v_column = (this->super_t_node).v_at.v_column;
    local_38.super_t_node._vptr_t_node = (_func_int **)&PTR__t_node_0019b1c0;
    t_null::f_emit(&local_38,a_emit,ptVar2->v_return_is_tail,false,false);
  }
  else {
    (*ptVar3->_vptr_t_node[3])(ptVar3,a_emit,(ulong)ptVar2->v_return_is_tail,0,0);
  }
  if (a_emit->v_targets->v_return_is_tail == true) {
    if (a_emit->v_stack !=
        ((long)(a_emit->v_scope->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(a_emit->v_scope->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) + 1U) {
      __assert_fail("a_emit.v_stack == a_emit.v_scope->v_privates.size() + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/ast.cc"
                    ,0x17c,
                    "virtual t_operand xemmai::ast::t_return::f_emit(t_emit &, bool, bool, bool)");
    }
    local_38.super_t_node._vptr_t_node = (_func_int **)t_code::v_labels[0x26];
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
               (void **)&local_38);
    aVar4 = extraout_RDX;
  }
  else {
    t_emit::f_join(a_emit,a_emit->v_targets->v_return_junction);
    local_38.super_t_node._vptr_t_node = (_func_int **)*t_code::v_labels;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
               (void **)&local_38);
    t_emit::operator<<(a_emit,a_emit->v_targets->v_return);
    aVar4 = extraout_RDX_00;
  }
  a_emit->v_stack = sVar1;
  if (!a_clear) {
    uVar5 = sVar1 + 1;
    a_emit->v_stack = uVar5;
    if (a_emit->v_code->v_size < uVar5) {
      a_emit->v_code->v_size = uVar5;
    }
  }
  tVar6.field_1.v_integer = aVar4.v_integer;
  tVar6._0_8_ = 4;
  return tVar6;
}

Assistant:

t_operand t_return::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto stack = a_emit.v_stack;
	a_emit.v_stack = a_emit.v_targets->v_return_stack;
	if (v_expression)
		v_expression->f_emit(a_emit, a_emit.v_targets->v_return_is_tail, false);
	else
		t_null(v_at).f_emit(a_emit, a_emit.v_targets->v_return_is_tail, false, false);
	if (a_emit.v_targets->v_return_is_tail) {
		assert(a_emit.v_stack == a_emit.v_scope->v_privates.size() + 1);
		a_emit << c_instruction__RETURN_T;
	} else {
		a_emit.f_join(*a_emit.v_targets->v_return_junction);
		a_emit << c_instruction__JUMP << *a_emit.v_targets->v_return;
	}
	a_emit.v_stack = stack;
	if (!a_clear) a_emit.f_push();
	return {};
}